

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcContain.c
# Opt level: O1

int Mvc_CoverContain(Mvc_Cover_t *pCover)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Mvc_Cube_t *pMVar5;
  Mvc_Cube_t *pMVar6;
  Mvc_Cube_t *pMVar7;
  Mvc_Cube_t *pMVar8;
  Mvc_Cube_t *pMVar9;
  Mvc_Cube_t *pMVar10;
  Mvc_Cube_t *pMVar11;
  bool bVar12;
  
  iVar2 = Mvc_CoverReadCubeNum(pCover);
  uVar3 = 0;
  if (1 < iVar2) {
    Mvc_CoverSetCubeSizes(pCover);
    Mvc_CoverSort(pCover,(Mvc_Cube_t *)0x0,Mvc_CubeCompareSizeAndInt);
    pMVar5 = Mvc_CoverReadCubeHead(pCover);
    pMVar6 = pMVar5->pNext;
    if (pMVar6 != (Mvc_Cube_t *)0x0) {
      pMVar9 = pMVar6->pNext;
      do {
        uVar3 = *(uint *)&pMVar5->field_0x8 & 0xffffff;
        pMVar8 = pMVar6;
        if (uVar3 == 0) {
          bVar12 = pMVar5->pData[0] == pMVar6->pData[0];
LAB_0040a5a0:
          if (bVar12) {
LAB_0040a5a7:
            pMVar8 = pMVar5;
            if (pMVar5 == (Mvc_Cube_t *)0x0) {
              pMVar8 = (Mvc_Cube_t *)&pCover->lCubes;
            }
            pMVar8->pNext = pMVar6->pNext;
            if ((pCover->lCubes).pTail == pMVar6) {
              if (pMVar6->pNext != (Mvc_Cube_t *)0x0) {
                __assert_fail("pCube->pNext == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcContain.c"
                              ,0x56,"void Mvc_CoverRemoveDuplicates(Mvc_Cover_t *)");
              }
              (pCover->lCubes).pTail = pMVar5;
            }
            piVar1 = &(pCover->lCubes).nItems;
            *piVar1 = *piVar1 + -1;
            Mvc_CubeFree(pCover,pMVar6);
            pMVar8 = pMVar5;
          }
        }
        else {
          if (uVar3 != 1) {
            do {
              if (pMVar5->pData[uVar3] != pMVar6->pData[uVar3]) goto LAB_0040a5db;
              bVar12 = 0 < (int)uVar3;
              uVar3 = uVar3 - 1;
            } while (bVar12);
            goto LAB_0040a5a7;
          }
          if (pMVar5->pData[0] == pMVar6->pData[0]) {
            bVar12 = *(int *)&pMVar5->field_0x14 == *(int *)&pMVar6->field_0x14;
            goto LAB_0040a5a0;
          }
        }
LAB_0040a5db:
        if (pMVar9 == (Mvc_Cube_t *)0x0) break;
        pMVar6 = pMVar9;
        pMVar9 = pMVar9->pNext;
        pMVar5 = pMVar8;
      } while( true );
    }
    pMVar6 = Mvc_CoverReadCubeHead(pCover);
    do {
      pMVar5 = pMVar6;
      do {
        pMVar9 = pMVar5;
        pMVar5 = pMVar9->pNext;
        if (pMVar5 == (Mvc_Cube_t *)0x0) goto LAB_0040a714;
      } while (pMVar6->nOnes == pMVar5->nOnes);
      for (; pMVar6 != (Mvc_Cube_t *)0x0; pMVar6 = pMVar6->pNext) {
        pMVar5 = pMVar9->pNext;
        if (pMVar5 != (Mvc_Cube_t *)0x0) {
          pMVar8 = pMVar5->pNext;
          pMVar10 = pMVar9;
          do {
            pMVar7 = pMVar8;
            uVar3 = *(uint *)&pMVar5->field_0x8 & 0xffffff;
            if (uVar3 == 0) {
              uVar3 = ~pMVar6->pData[0] & pMVar5->pData[0];
            }
            else if (uVar3 == 1) {
              uVar3 = 1;
              if ((pMVar5->pData[0] & ~pMVar6->pData[0]) == 0) {
                uVar3 = (uint)((*(uint *)&pMVar5->field_0x14 & ~*(uint *)&pMVar6->field_0x14) != 0);
              }
            }
            else {
              do {
                if ((pMVar5->pData[uVar3] & ~pMVar6->pData[uVar3]) != 0) {
                  uVar3 = 1;
                  goto LAB_0040a6b0;
                }
                bVar12 = 0 < (int)uVar3;
                uVar3 = uVar3 - 1;
              } while (bVar12);
              uVar3 = 0;
            }
LAB_0040a6b0:
            pMVar11 = pMVar5;
            if (uVar3 == 0) {
              pMVar8 = pMVar10;
              if (pMVar10 == (Mvc_Cube_t *)0x0) {
                pMVar8 = (Mvc_Cube_t *)&pCover->lCubes;
              }
              pMVar8->pNext = pMVar5->pNext;
              if ((pCover->lCubes).pTail == pMVar5) {
                if (pMVar5->pNext != (Mvc_Cube_t *)0x0) {
                  __assert_fail("pCube->pNext == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcContain.c"
                                ,0x97,"void Mvc_CoverRemoveContained(Mvc_Cover_t *)");
                }
                (pCover->lCubes).pTail = pMVar10;
              }
              piVar1 = &(pCover->lCubes).nItems;
              *piVar1 = *piVar1 + -1;
              Mvc_CubeFree(pCover,pMVar5);
              pMVar11 = pMVar10;
            }
            if (pMVar7 == (Mvc_Cube_t *)0x0) break;
            pMVar8 = pMVar7->pNext;
            pMVar5 = pMVar7;
            pMVar10 = pMVar11;
          } while( true );
        }
        if (pMVar6 == pMVar9) break;
      }
      pMVar6 = pMVar9->pNext;
    } while (pMVar6 != (Mvc_Cube_t *)0x0);
LAB_0040a714:
    iVar4 = Mvc_CoverReadCubeNum(pCover);
    uVar3 = (uint)(iVar2 != iVar4);
  }
  return uVar3;
}

Assistant:

int  Mvc_CoverContain( Mvc_Cover_t * pCover )
{
    int nCubes;
    nCubes = Mvc_CoverReadCubeNum( pCover );
    if ( nCubes < 2 )
        return 0;
    Mvc_CoverSetCubeSizes(pCover);
    Mvc_CoverSort( pCover, NULL, Mvc_CubeCompareSizeAndInt );
    Mvc_CoverRemoveDuplicates( pCover );
    if ( nCubes > 1 )
        Mvc_CoverRemoveContained( pCover );
    return (nCubes != Mvc_CoverReadCubeNum(pCover));
}